

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O1

Optional<Corrade::Containers::String> *
Corrade::Utility::Path::libraryLocation
          (Optional<Corrade::Containers::String> *__return_storage_ptr__,void *address)

{
  int iVar1;
  Dl_info info;
  Error local_60;
  char *local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_28 = 0;
  uStack_20 = 0;
  local_38 = (char *)0x0;
  uStack_30 = 0;
  iVar1 = dladdr(address);
  if (iVar1 == 0) {
    Error::Error(&local_60,(Flags)0x0);
    Debug::operator<<(&local_60.super_Debug,
                      "Utility::Path::libraryLocation(): can\'t get library location");
    Error::~Error(&local_60);
    __return_storage_ptr__->_set = false;
  }
  else {
    Containers::String::String
              ((String *)&local_60,(nullptr_t)0x0,(nullptr_t)0x0,(nullptr_t)0x0,local_38);
    __return_storage_ptr__->_set = true;
    Containers::String::String((String *)__return_storage_ptr__,(String *)&local_60);
    Containers::String::~String((String *)&local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

Containers::Optional<Containers::String> libraryLocation(const void* address) {
    /* Linux (and macOS as well, even though Linux man pages don't mention that) */
    #ifdef CORRADE_TARGET_UNIX
    /* Otherwise GCC 4.8 loudly complains about missing initializers */
    Dl_info info{nullptr, nullptr, nullptr, nullptr};
    if(!dladdr(address, &info)) {
        Error{} << "Utility::Path::libraryLocation(): can't get library location";
        /* According to manpages, the dlerror is *never* available. But
            CORRADE_INTERNAL_ASSERT(!dlerror());
           seems to be a bad idea, since ThreadSanitizer can trigger it when
           address is null. Reproducible in PathTest::libraryLocationNull(). */
        return {};
    }

    return Containers::String{info.dli_fname};
    #elif defined(CORRADE_TARGET_WINDOWS) && !defined(CORRADE_TARGET_WINDOWS_RT)
    HMODULE module{};
    if(!GetModuleHandleExA(GET_MODULE_HANDLE_EX_FLAG_FROM_ADDRESS|GET_MODULE_HANDLE_EX_FLAG_UNCHANGED_REFCOUNT, reinterpret_cast<const char*>(address), &module)) {
        Error err;
        err << "Utility::Path::libraryLocation(): can't get library location:";
        Utility::Implementation::printWindowsErrorString(err, GetLastError());
        return {};
    }

    /** @todo get rid of MAX_PATH */
    wchar_t path[MAX_PATH + 1];
    /* Returns size *without* the null terminator */
    const std::size_t size = GetModuleFileNameW(module, path, Containers::arraySize(path));
    return fromNativeSeparators(Unicode::narrow(Containers::arrayView(path, size)));
    #endif
}